

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O1

uint ClownLZSS::Internal::Gba::ReadHeader<std::ifstream>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  std::istream::get();
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  return (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

unsigned int ReadHeader(DecompressorInput<T> &input)
			{
				input.Read(); // Skip compression type byte
				return input.Read() + (input.Read() << 8) + (input.Read() << 16);
			}